

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseTagModuleField(WastParser *this,Module *module)

{
  ModuleField *pMVar1;
  ModuleFieldMixin<(wabt::ModuleFieldType)10> *pMVar2;
  _func_int ***ppp_Var3;
  bool bVar4;
  Result RVar5;
  TagModuleField *import;
  Enum EVar6;
  long *plVar7;
  long lVar8;
  string_view name_00;
  string_view name_01;
  string name;
  ModuleFieldList export_fields;
  Location loc;
  string local_128;
  _Head_base<0UL,_wabt::TagModuleField_*,_false> local_108;
  __uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> local_100;
  undefined1 *local_f8;
  long lStack_f0;
  long local_e8;
  long lStack_e0;
  ModuleFieldList local_d8;
  undefined1 *local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined1 local_90 [32];
  undefined1 *local_70;
  undefined1 local_60 [16];
  long *local_50 [2];
  long local_40 [2];
  
  if ((this->options_->features).exceptions_enabled_ == false) {
    Consume((Token *)local_90,this);
    Error(this,0x199fc3);
    return (Result)Error;
  }
  RVar5 = Expect(this,Lpar);
  if (RVar5.enum_ == Error) {
    return (Result)Error;
  }
  RVar5 = Expect(this,Tag);
  if (RVar5.enum_ == Error) {
    return (Result)Error;
  }
  GetToken((Token *)local_90,this);
  uStack_b0 = CONCAT44(local_90._12_4_,local_90._8_4_);
  local_a8 = CONCAT44(local_90._20_4_,local_90._16_4_);
  uStack_a0 = CONCAT44(local_90._28_4_,local_90._24_4_);
  local_b8 = (undefined1 *)local_90._0_8_;
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  local_128._M_string_length = 0;
  local_128.field_2._M_local_buf[0] = '\0';
  ParseBindVarOpt(this,&local_128);
  local_d8.size_ = 0;
  local_d8.first_ = (ModuleField *)0x0;
  local_d8.last_ = (ModuleField *)0x0;
  RVar5 = ParseInlineExports(this,&local_d8,Last);
  EVar6 = Error;
  if (RVar5.enum_ == Error) goto LAB_0013b4a1;
  bVar4 = PeekMatchLpar(this,Import);
  if (bVar4) {
    CheckImportOrdering(this,module);
    import = (TagModuleField *)operator_new(0x160);
    (((string *)
     &(import->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField.
      super_intrusive_list_base<wabt::ModuleField>)->_M_dataplus)._M_p =
         (pointer)&(import->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField.loc
    ;
    ((string *)
    &(import->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField.
     super_intrusive_list_base<wabt::ModuleField>)->_M_string_length = 0;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)&(import->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField.loc)->
    _M_local_buf[0] = '\0';
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)&(import->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField.loc)->
          _M_local_buf + 0x10) =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)&(import->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField.type_;
    pMVar2 = &import->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>;
    *(char *)((long)&(pMVar2->super_ModuleField).loc.field_1 + 8) = '\0';
    *(char *)((long)&(pMVar2->super_ModuleField).loc.field_1 + 9) = '\0';
    *(char *)((long)&(pMVar2->super_ModuleField).loc.field_1 + 10) = '\0';
    *(char *)((long)&(pMVar2->super_ModuleField).loc.field_1 + 0xb) = '\0';
    *(char *)((long)&(pMVar2->super_ModuleField).loc.field_1 + 0xc) = '\0';
    *(char *)((long)&(pMVar2->super_ModuleField).loc.field_1 + 0xd) = '\0';
    *(char *)((long)&(pMVar2->super_ModuleField).loc.field_1 + 0xe) = '\0';
    *(char *)((long)&(pMVar2->super_ModuleField).loc.field_1 + 0xf) = '\0';
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)&(import->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField.type_)->
    _M_local_buf[0] = '\0';
    *(undefined4 *)&(import->tag).name._M_string_length = 4;
    (import->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField._vptr_ModuleField
         = (_func_int **)&PTR__TagImport_001d2470;
    name_00._M_str = local_128._M_dataplus._M_p;
    name_00._M_len = local_128._M_string_length;
    Tag::Tag((Tag *)&(import->tag).name.field_2,name_00);
    RVar5 = ParseInlineImport(this,(Import *)import);
    if (((RVar5.enum_ != Error) &&
        (RVar5 = ParseTypeUseOpt(this,(FuncDeclaration *)
                                      &(import->tag).decl.type_var.loc.filename._M_str),
        RVar5.enum_ != Error)) &&
       (RVar5 = ParseUnboundFuncSignature
                          (this,(FuncSignature *)
                                &(import->tag).decl.sig.param_types.
                                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl
                                 .super__Vector_impl_data._M_end_of_storage), RVar5.enum_ != Error))
    {
      local_90._0_8_ = local_90 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"type","");
      local_70 = local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"param","");
      plVar7 = local_40;
      local_50[0] = plVar7;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"result","");
      local_f8 = (undefined1 *)0x0;
      lStack_f0 = 0;
      local_e8 = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_f8,
                 local_90,&stack0xffffffffffffffd0);
      RVar5 = ErrorIfLpar(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_f8,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_f8);
      lVar8 = -0x60;
      do {
        if (plVar7 != (long *)plVar7[-2]) {
          operator_delete((long *)plVar7[-2],*plVar7 + 1);
        }
        plVar7 = plVar7 + -4;
        lVar8 = lVar8 + 0x20;
      } while (lVar8 != 0);
      if (RVar5.enum_ != Error) {
        GetToken((Token *)local_90,this);
        lStack_f0 = CONCAT44(local_90._12_4_,local_90._8_4_);
        local_e8 = CONCAT44(local_90._20_4_,local_90._16_4_);
        lStack_e0 = CONCAT44(local_90._28_4_,local_90._24_4_);
        local_f8 = (undefined1 *)local_90._0_8_;
        local_100._M_t.
        super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
        .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl =
             (tuple<wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>)
             operator_new(0x48);
        *(long *)((long)local_100._M_t.
                        super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                        .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 8) =
             0;
        *(long *)((long)local_100._M_t.
                        super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                        .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x10
                 ) = 0;
        *(undefined ***)
         local_100._M_t.
         super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
         .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl =
             &PTR__ModuleField_001d1cc0;
        *(undefined1 **)
         ((long)local_100._M_t.
                super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x18) =
             local_f8;
        *(long *)((long)local_100._M_t.
                        super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                        .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x20
                 ) = lStack_f0;
        *(long *)((long)local_100._M_t.
                        super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                        .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x28
                 ) = local_e8;
        *(long *)((long)local_100._M_t.
                        super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                        .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x30
                 ) = lStack_e0;
        *(undefined4 *)
         ((long)local_100._M_t.
                super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x38) = 2;
        *(undefined ***)
         local_100._M_t.
         super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
         .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl =
             &PTR__ImportModuleField_001d24f0;
        *(TagModuleField **)
         ((long)local_100._M_t.
                super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x40) =
             import;
        Module::AppendField(module,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                    *)&local_100);
        if ((_Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
             )local_100._M_t.
              super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
              .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl !=
            (ImportModuleField *)0x0) {
          (**(code **)(*(long *)local_100._M_t.
                                super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                                .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>.
                                _M_head_impl + 8))();
        }
        local_100._M_t.
        super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
        .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl =
             (tuple<wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>)
             (_Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
              )0x0;
        goto LAB_0013b50c;
      }
    }
  }
  else {
    import = (TagModuleField *)operator_new(0x150);
    (((string *)
     &(import->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField.
      super_intrusive_list_base<wabt::ModuleField>)->_M_dataplus)._M_p = (pointer)0x0;
    ((string *)
    &(import->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField.
     super_intrusive_list_base<wabt::ModuleField>)->_M_string_length = 0;
    (import->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField._vptr_ModuleField
         = (_func_int **)&PTR__ModuleField_001d1cc0;
    *(undefined8 *)
     (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)&(import->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField.loc)->
      _M_local_buf + 0x10) = local_a8;
    *(undefined8 *)
     (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)&(import->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField.loc)->
      _M_local_buf + 0x18) = uStack_a0;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)&(import->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField.loc)->
    _M_allocated_capacity = (size_type)local_b8;
    *(undefined8 *)
     ((long)&(import->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField.loc + 8)
         = uStack_b0;
    *(undefined4 *)
     &(import->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField.type_ = 10;
    (import->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField._vptr_ModuleField
         = (_func_int **)&PTR__TagModuleField_001d2540;
    name_01._M_str = local_128._M_dataplus._M_p;
    name_01._M_len = local_128._M_string_length;
    Tag::Tag(&import->tag,name_01);
    RVar5 = ParseTypeUseOpt(this,&(import->tag).decl);
    if ((RVar5.enum_ != Error) &&
       (RVar5 = ParseUnboundFuncSignature(this,&(import->tag).decl.sig), RVar5.enum_ != Error)) {
      local_108._M_head_impl = import;
      Module::AppendField(module,(unique_ptr<wabt::TagModuleField,_std::default_delete<wabt::TagModuleField>_>
                                  *)&local_108);
      if (local_108._M_head_impl != (TagModuleField *)0x0) {
        (*((local_108._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).
          super_ModuleField._vptr_ModuleField[1])();
      }
      local_108._M_head_impl = (TagModuleField *)0x0;
LAB_0013b50c:
      anon_unknown_1::AppendInlineExportFields
                (module,&local_d8,
                 (int)((ulong)((long)(module->tags).
                                     super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)(module->tags).
                                    super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 3) - 1);
      RVar5 = Expect(this,Rpar);
      EVar6 = (Enum)(RVar5.enum_ == Error);
      goto LAB_0013b4a1;
    }
  }
  (*(import->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField._vptr_ModuleField
    [1])(import);
LAB_0013b4a1:
  pMVar1 = local_d8.first_;
  while (pMVar1 != (ModuleField *)0x0) {
    ppp_Var3 = &pMVar1->_vptr_ModuleField;
    pMVar1 = (pMVar1->super_intrusive_list_base<wabt::ModuleField>).next_;
    (*(*ppp_Var3)[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,
                    CONCAT71(local_128.field_2._M_allocated_capacity._1_7_,
                             local_128.field_2._M_local_buf[0]) + 1);
  }
  return (Result)EVar6;
}

Assistant:

Result WastParser::ParseTagModuleField(Module* module) {
  WABT_TRACE(ParseTagModuleField);
  if (!options_->features.exceptions_enabled()) {
    Error(Consume().loc, "tag not allowed");
    return Result::Error;
  }
  EXPECT(Lpar);
  EXPECT(Tag);
  Location loc = GetLocation();

  std::string name;
  ParseBindVarOpt(&name);

  ModuleFieldList export_fields;
  CHECK_RESULT(ParseInlineExports(&export_fields, ExternalKind::Tag));

  if (PeekMatchLpar(TokenType::Import)) {
    CheckImportOrdering(module);
    auto import = std::make_unique<TagImport>(name);
    Tag& tag = import->tag;
    CHECK_RESULT(ParseInlineImport(import.get()));
    CHECK_RESULT(ParseTypeUseOpt(&tag.decl));
    CHECK_RESULT(ParseUnboundFuncSignature(&tag.decl.sig));
    CHECK_RESULT(ErrorIfLpar({"type", "param", "result"}));
    auto field =
        std::make_unique<ImportModuleField>(std::move(import), GetLocation());
    module->AppendField(std::move(field));
  } else {
    auto field = std::make_unique<TagModuleField>(loc, name);
    CHECK_RESULT(ParseTypeUseOpt(&field->tag.decl));
    CHECK_RESULT(ParseUnboundFuncSignature(&field->tag.decl.sig));
    module->AppendField(std::move(field));
  }

  AppendInlineExportFields(module, &export_fields, module->tags.size() - 1);

  EXPECT(Rpar);
  return Result::Ok;
}